

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMuxError MuxGet(WebPMux *mux,CHUNK_INDEX idx,uint32_t nth,WebPData *data)

{
  WebPChunk *pWVar1;
  undefined8 *in_RCX;
  int in_ESI;
  WebPChunk *chunk_4;
  WebPChunk *chunk_3;
  WebPChunk *chunk_2;
  WebPChunk *chunk_1;
  WebPChunk *chunk;
  uint32_t tag;
  undefined8 in_stack_ffffffffffffffd0;
  uint32_t nth_00;
  WebPChunk *in_stack_ffffffffffffffd8;
  WebPMuxError local_4;
  
  WebPDataInit((WebPData *)0x10a690);
  tag = (uint32_t)in_stack_ffffffffffffffd0;
  nth_00 = (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (in_ESI == 0) {
    pWVar1 = ChunkSearchList(in_stack_ffffffffffffffd8,nth_00,tag);
    if (pWVar1 == (WebPChunk *)0x0) {
      local_4 = WEBP_MUX_NOT_FOUND;
    }
    else {
      *in_RCX = (pWVar1->data).bytes;
      in_RCX[1] = (pWVar1->data).size;
      local_4 = WEBP_MUX_OK;
    }
  }
  else if (in_ESI == 1) {
    pWVar1 = ChunkSearchList(in_stack_ffffffffffffffd8,nth_00,tag);
    if (pWVar1 == (WebPChunk *)0x0) {
      local_4 = WEBP_MUX_NOT_FOUND;
    }
    else {
      *in_RCX = (pWVar1->data).bytes;
      in_RCX[1] = (pWVar1->data).size;
      local_4 = WEBP_MUX_OK;
    }
  }
  else if (in_ESI == 2) {
    pWVar1 = ChunkSearchList(in_stack_ffffffffffffffd8,nth_00,tag);
    if (pWVar1 == (WebPChunk *)0x0) {
      local_4 = WEBP_MUX_NOT_FOUND;
    }
    else {
      *in_RCX = (pWVar1->data).bytes;
      in_RCX[1] = (pWVar1->data).size;
      local_4 = WEBP_MUX_OK;
    }
  }
  else if (in_ESI == 7) {
    pWVar1 = ChunkSearchList(in_stack_ffffffffffffffd8,nth_00,tag);
    if (pWVar1 == (WebPChunk *)0x0) {
      local_4 = WEBP_MUX_NOT_FOUND;
    }
    else {
      *in_RCX = (pWVar1->data).bytes;
      in_RCX[1] = (pWVar1->data).size;
      local_4 = WEBP_MUX_OK;
    }
  }
  else if (in_ESI == 8) {
    pWVar1 = ChunkSearchList(in_stack_ffffffffffffffd8,nth_00,tag);
    if (pWVar1 == (WebPChunk *)0x0) {
      local_4 = WEBP_MUX_NOT_FOUND;
    }
    else {
      *in_RCX = (pWVar1->data).bytes;
      in_RCX[1] = (pWVar1->data).size;
      local_4 = WEBP_MUX_OK;
    }
  }
  else {
    local_4 = WEBP_MUX_NOT_FOUND;
  }
  return local_4;
}

Assistant:

static WebPMuxError MuxGet(const WebPMux* const mux, CHUNK_INDEX idx,
                           uint32_t nth, WebPData* const data) {
  assert(mux != NULL);
  assert(idx != IDX_LAST_CHUNK);
  assert(!IsWPI(kChunks[idx].id));
  WebPDataInit(data);

  SWITCH_ID_LIST(IDX_VP8X, mux->vp8x);
  SWITCH_ID_LIST(IDX_ICCP, mux->iccp);
  SWITCH_ID_LIST(IDX_ANIM, mux->anim);
  SWITCH_ID_LIST(IDX_EXIF, mux->exif);
  SWITCH_ID_LIST(IDX_XMP, mux->xmp);
  assert(idx != IDX_UNKNOWN);
  return WEBP_MUX_NOT_FOUND;
}